

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

void __thiscall cmFindPackageCommand::FillPrefixesSystemRegistry(cmFindPackageCommand *this)

{
  mapped_type *searchPath;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string debugBuffer;
  string local_88;
  string local_68;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_48;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_28;
  undefined8 local_20;
  
  if (((this->NoSystemRegistry == false) && ((this->super_cmFindCommon).NoDefaultPath == false)) &&
     ((this->super_cmFindCommon).DebugMode == true)) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "CMake System Package Registry [CMAKE_FIND_PACKAGE_NO_SYSTEM_PACKAGE_REGISTRY].\n",""
              );
    searchPath = std::
                 map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
                 ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                              &PathLabel::SystemRegistry.super_PathLabel);
    anon_unknown.dwarf_1417000::collectPathsForDebug(&local_88,searchPath,0);
    local_48.first._M_str = (this->DebugBuffer)._M_dataplus._M_p;
    local_48.first._M_len = (this->DebugBuffer)._M_string_length;
    local_48.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_30 = local_88._M_string_length;
    local_28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_88._M_dataplus._M_p;
    local_20 = 0;
    views._M_len = 2;
    views._M_array = &local_48;
    cmCatViews(&local_68,views);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesSystemRegistry()
{
  if (this->NoSystemRegistry || this->NoDefaultPath) {
    return;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LoadPackageRegistryWinSystem();
#endif

  if (this->DebugMode) {
    std::string debugBuffer =
      "CMake System Package Registry "
      "[CMAKE_FIND_PACKAGE_NO_SYSTEM_PACKAGE_REGISTRY].\n";
    collectPathsForDebug(debugBuffer,
                         this->LabeledPaths[PathLabel::SystemRegistry]);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}